

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_siz_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 tmp;
  opj_tcp_v2_t *l_current_tile_param;
  opj_image_comp_t *l_img_comp;
  opj_cp_v2_t *l_cp;
  opj_image_t *l_image;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_nb_tiles;
  OPJ_UINT32 l_remaining_size;
  OPJ_UINT32 l_nb_comp_remain;
  OPJ_UINT32 l_nb_comp;
  OPJ_UINT32 i;
  OPJ_UINT32 l_size;
  uint local_6c;
  long local_68;
  uint *local_60;
  uint *local_58;
  OPJ_UINT32 *local_50;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint local_30;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  local_60 = (uint *)0x0;
  local_68 = 0;
  local_50 = *(OPJ_UINT32 **)(in_RDI + 0x60);
  local_58 = (uint *)(in_RDI + 0x70);
  if (in_EDX < 0x24) {
    opj_event_msg_v2(in_RCX,1,"Error with SIZ marker size\n");
    local_4 = 0;
  }
  else {
    uVar1 = in_EDX - 0x24;
    uVar2 = uVar1 / 3;
    if (uVar1 % 3 == 0) {
      opj_read_bytes_LE(in_RSI,(OPJ_UINT32 *)&stack0xffffffffffffffbc,2);
      *local_58 = in_stack_ffffffffffffffbc;
      opj_read_bytes_LE(in_RSI + 2,local_50 + 2,4);
      opj_read_bytes_LE(in_RSI + 6,local_50 + 3,4);
      opj_read_bytes_LE(in_RSI + 10,local_50,4);
      opj_read_bytes_LE(in_RSI + 0xe,local_50 + 1,4);
      opj_read_bytes_LE(in_RSI + 0x12,local_58 + 3,4);
      opj_read_bytes_LE(in_RSI + 0x16,local_58 + 4,4);
      opj_read_bytes_LE(in_RSI + 0x1a,local_58 + 1,4);
      opj_read_bytes_LE(in_RSI + 0x1e,local_58 + 2,4);
      opj_read_bytes_LE(in_RSI + 0x22,(OPJ_UINT32 *)&stack0xffffffffffffffbc,2);
      local_18 = in_RSI + 0x24;
      if (in_stack_ffffffffffffffbc < 0x4001) {
        local_50[4] = in_stack_ffffffffffffffbc & 0xffff;
        if (local_50[4] == uVar2) {
          pvVar4 = calloc((ulong)local_50[4],0x38);
          *(void **)(local_50 + 6) = pvVar4;
          if (*(long *)(local_50 + 6) == 0) {
            local_50[4] = 0;
            opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n");
            local_4 = 0;
          }
          else {
            memset(*(void **)(local_50 + 6),0,(ulong)local_50[4] * 0x38);
            local_60 = *(uint **)(local_50 + 6);
            for (local_30 = 0; local_30 < local_50[4]; local_30 = local_30 + 1) {
              opj_read_bytes_LE(local_18,&local_6c,1);
              local_60[6] = (local_6c & 0x7f) + 1;
              local_60[8] = local_6c >> 7;
              opj_read_bytes_LE(local_18 + 1,&local_6c,1);
              *local_60 = local_6c;
              opj_read_bytes_LE(local_18 + 2,&local_6c,1);
              local_18 = local_18 + 3;
              local_60[1] = local_6c;
              local_60[9] = 0;
              local_60[10] = local_58[0x1a];
              local_60 = local_60 + 0xe;
            }
            uVar2 = int_ceildiv(local_50[2] - local_58[1],local_58[3]);
            local_58[8] = uVar2;
            uVar2 = int_ceildiv(local_50[3] - local_58[2],local_58[4]);
            local_58[9] = uVar2;
            uVar2 = local_58[8] * local_58[9];
            if ((*(byte *)(in_RDI + 0x5c) >> 1 & 1) == 0) {
              *(undefined4 *)(in_RDI + 0x28) = 0;
              *(undefined4 *)(in_RDI + 0x2c) = 0;
              *(uint *)(in_RDI + 0x30) = local_58[8];
              *(uint *)(in_RDI + 0x34) = local_58[9];
            }
            else {
              *(uint *)(in_RDI + 0x28) = (*(int *)(in_RDI + 0x28) - local_58[1]) / local_58[3];
              *(uint *)(in_RDI + 0x2c) = (*(int *)(in_RDI + 0x2c) - local_58[2]) / local_58[4];
              iVar3 = int_ceildiv(*(int *)(in_RDI + 0x30) - local_58[1],local_58[3]);
              *(int *)(in_RDI + 0x30) = iVar3;
              iVar3 = int_ceildiv(*(int *)(in_RDI + 0x34) - local_58[2],local_58[4]);
              *(int *)(in_RDI + 0x34) = iVar3;
            }
            pvVar4 = calloc((ulong)uVar2,0x1630);
            *(void **)(local_58 + 0x18) = pvVar4;
            if (*(long *)(local_58 + 0x18) == 0) {
              opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n");
              local_4 = 0;
            }
            else {
              memset(*(void **)(local_58 + 0x18),0,(ulong)uVar2 * 0x15e8);
              pvVar4 = calloc((ulong)local_50[4],0x438);
              *(void **)(*(long *)(in_RDI + 0x10) + 0x15d0) = pvVar4;
              if (*(long *)(*(long *)(in_RDI + 0x10) + 0x15d0) == 0) {
                opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n");
                local_4 = 0;
              }
              else {
                memset(*(void **)(*(long *)(in_RDI + 0x10) + 0x15d0),0,(ulong)local_50[4] * 0x438);
                pvVar4 = malloc(0x140);
                *(void **)(*(long *)(in_RDI + 0x10) + 0x1608) = pvVar4;
                if (*(long *)(*(long *)(in_RDI + 0x10) + 0x1608) == 0) {
                  opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n");
                  local_4 = 0;
                }
                else {
                  memset(*(void **)(*(long *)(in_RDI + 0x10) + 0x1608),0,0x140);
                  *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x1614) = 10;
                  pvVar4 = malloc(0x140);
                  *(void **)(*(long *)(in_RDI + 0x10) + 0x1618) = pvVar4;
                  if (*(long *)(*(long *)(in_RDI + 0x10) + 0x1618) == 0) {
                    opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n");
                    local_4 = 0;
                  }
                  else {
                    memset(*(void **)(*(long *)(in_RDI + 0x10) + 0x1618),0,0x140);
                    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x1624) = 10;
                    for (local_30 = 0; local_30 < local_50[4]; local_30 = local_30 + 1) {
                      if (*(int *)(*(long *)(local_50 + 6) + (ulong)local_30 * 0x38 + 0x20) == 0) {
                        *(int *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x15d0) +
                                 (ulong)local_30 * 0x438 + 0x434) =
                             1 << ((char)*(undefined4 *)
                                          (*(long *)(local_50 + 6) + (ulong)local_30 * 0x38 + 0x18)
                                   - 1U & 0x1f);
                      }
                    }
                    local_68 = *(long *)(local_58 + 0x18);
                    for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
                      pvVar4 = malloc((ulong)local_50[4] * 0x438);
                      *(void **)(local_68 + 0x15d0) = pvVar4;
                      if (*(long *)(local_68 + 0x15d0) == 0) {
                        opj_event_msg_v2(in_RCX,1,"Not enough memory to take in charge SIZ marker\n"
                                        );
                        return 0;
                      }
                      memset(*(void **)(local_68 + 0x15d0),0,(ulong)local_50[4] * 0x438);
                      local_68 = local_68 + 0x1630;
                    }
                    *(undefined4 *)(in_RDI + 8) = 4;
                    opj_image_comp_header_update
                              ((opj_image_t *)CONCAT44(uVar1,uVar2),
                               (opj_cp_v2 *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
                    local_4 = 1;
                  }
                }
              }
            }
          }
        }
        else {
          opj_event_msg_v2(in_RCX,1,
                           "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n"
                           ,(ulong)local_50[4],(ulong)uVar2);
          local_4 = 0;
        }
      }
      else {
        opj_event_msg_v2(in_RCX,1,"Error with SIZ marker: number of component is illegal -> %d\n",
                         (ulong)in_stack_ffffffffffffffbc);
        local_4 = 0;
      }
    }
    else {
      opj_event_msg_v2(in_RCX,1,"Error with SIZ marker size\n");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_siz_v2 (
				    opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_size, i;
	OPJ_UINT32 l_nb_comp;
	OPJ_UINT32 l_nb_comp_remain;
	OPJ_UINT32 l_remaining_size;
	OPJ_UINT32 l_nb_tiles;
	OPJ_UINT32 l_tmp;
	opj_image_t *l_image = 00;
	opj_cp_v2_t *l_cp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcp_v2_t * l_current_tile_param = 00;

	/* preconditions */
	assert(p_j2k != 00);
	assert(p_manager != 00);
	assert(p_header_data != 00);

	l_image = p_j2k->m_private_image;
	l_cp = &(p_j2k->m_cp);

	/* minimum size == 39 - 3 (= minimum component parameter) */
	if (p_header_size < 36) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_remaining_size = p_header_size - 36;
	l_nb_comp = l_remaining_size / 3;
	l_nb_comp_remain = l_remaining_size % 3;
	if (l_nb_comp_remain != 0){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker size\n");
		return OPJ_FALSE;
	}

	l_size = p_header_size + 2;										/* Lsiz */

	opj_read_bytes(p_header_data,&l_tmp ,2);						/* Rsiz (capabilities) */
	p_header_data+=2;
	l_cp->rsiz = (OPJ_RSIZ_CAPABILITIES) l_tmp;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x1, 4);	/* Xsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y1, 4);	/* Ysiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->x0, 4);	/* X0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_image->y0, 4);	/* Y0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdx, 4);		/* XTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tdy, 4);		/* YTsiz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->tx0, 4);		/* XT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_cp->ty0, 4);		/* YT0siz */
	p_header_data+=4;
	opj_read_bytes(p_header_data, (OPJ_UINT32*) &l_tmp, 2);			/* Csiz */
	p_header_data+=2;
	if (l_tmp < 16385)
		l_image->numcomps = (OPJ_UINT16) l_tmp;
	else {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is illegal -> %d\n", l_tmp);
		return OPJ_FALSE;
	}

	if (l_image->numcomps != l_nb_comp) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with SIZ marker: number of component is not compatible with the remaining number of parameters ( %d vs %d)\n", l_image->numcomps, l_nb_comp);
		return OPJ_FALSE;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if (!(l_image->x1 * l_image->y1)) {
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"JPWL: bad image size (%d x %d)\n",
				l_image->x1, l_image->y1);
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}

	/* FIXME check previously in the function so why keep this piece of code ? Need by the norm ?
		if (l_image->numcomps != ((len - 38) / 3)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: Csiz is %d => space in SIZ only for %d comps.!!!\n",
				l_image->numcomps, ((len - 38) / 3));
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
	*/		/* we try to correct */
	/*		opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust this\n");
			if (l_image->numcomps < ((len - 38) / 3)) {
				len = 38 + 3 * l_image->numcomps;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Lsiz to %d => HYPOTHESIS!!!\n",
					len);
			} else {
				l_image->numcomps = ((len - 38) / 3);
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting Csiz to %d => HYPOTHESIS!!!\n",
					l_image->numcomps);
			}
		}
	*/

		/* update components number in the jpwl_exp_comps filed */
		l_cp->exp_comps = l_image->numcomps;
	}
#endif /* USE_JPWL */

	/* Allocate the resulting image components */
	l_image->comps = (opj_image_comp_t*) opj_calloc(l_image->numcomps, sizeof(opj_image_comp_t));
	if (l_image->comps == 00){
		l_image->numcomps = 0;
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}

	memset(l_image->comps,0,l_image->numcomps * sizeof(opj_image_comp_t));
	l_img_comp = l_image->comps;

	/* Read the component information */
	for (i = 0; i < l_image->numcomps; ++i){
		OPJ_UINT32 tmp;
		opj_read_bytes(p_header_data,&tmp,1);	/* Ssiz_i */
		++p_header_data;
		l_img_comp->prec = (tmp & 0x7f) + 1;
		l_img_comp->sgnd = tmp >> 7;
		opj_read_bytes(p_header_data,&tmp,1);	/* XRsiz_i */
		++p_header_data;
		l_img_comp->dx = (OPJ_INT32)tmp; /* should be between 1 and 255 */
		opj_read_bytes(p_header_data,&tmp,1);	/* YRsiz_i */
		++p_header_data;
		l_img_comp->dy = (OPJ_INT32)tmp; /* should be between 1 and 255 */

#ifdef USE_JPWL
		if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
			too much the SIZ parameters, again */
			if (!(l_image->comps[i].dx * l_image->comps[i].dy)) {
				opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
					"JPWL: bad XRsiz_%d/YRsiz_%d (%d x %d)\n",
					i, i, l_image->comps[i].dx, l_image->comps[i].dy);
				if (!JPWL_ASSUME) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
					return OPJ_FALSE;
				}
				/* we try to correct */
				opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
				if (!l_image->comps[i].dx) {
					l_image->comps[i].dx = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting XRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dx);
				}
				if (!l_image->comps[i].dy) {
					l_image->comps[i].dy = 1;
					opj_event_msg_v2(p_manager, EVT_WARNING, "- setting YRsiz_%d to %d => HYPOTHESIS!!!\n",
						i, l_image->comps[i].dy);
				}
			}
		}
#endif /* USE_JPWL */
		l_img_comp->resno_decoded = 0;								/* number of resolution decoded */
		l_img_comp->factor = l_cp->m_specific_param.m_dec.m_reduce; /* reducing factor per component */
		++l_img_comp;
	}

	/* Compute the number of tiles */
	l_cp->tw = int_ceildiv(l_image->x1 - l_cp->tx0, l_cp->tdx);
	l_cp->th = int_ceildiv(l_image->y1 - l_cp->ty0, l_cp->tdy);
	l_nb_tiles = l_cp->tw * l_cp->th;

	/* Define the tiles which will be decoded */
	if (p_j2k->m_specific_param.m_decoder.m_discard_tiles) {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_j2k->m_specific_param.m_decoder.m_start_tile_x - l_cp->tx0) / l_cp->tdx;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_j2k->m_specific_param.m_decoder.m_start_tile_y - l_cp->ty0) / l_cp->tdy;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_x - l_cp->tx0), l_cp->tdx);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_j2k->m_specific_param.m_decoder.m_end_tile_y - l_cp->ty0), l_cp->tdy);
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
	}

#ifdef USE_JPWL
	if (l_cp->correct) {
		/* if JPWL is on, we check whether TX errors have damaged
		  too much the SIZ parameters */
		if ((l_cp->tw < 1) || (l_cp->th < 1) || (l_cp->tw > l_cp->max_tiles) || (l_cp->th > l_cp->max_tiles)) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: bad number of tiles (%d x %d)\n",
				l_cp->tw, l_cp->th);
			if (!JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
			/* we try to correct */
			opj_event_msg_v2(p_manager, EVT_WARNING, "- trying to adjust them\n");
			if (l_cp->tw < 1) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in x => HYPOTHESIS!!!\n",
						l_cp->tw);
			}
			if (l_cp->tw > l_cp->max_tiles) {
				l_cp->tw= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large x, increase expectance of %d\n"
					"- setting %d tiles in x => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->tw);
			}
			if (l_cp->th < 1) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- setting %d tiles in y => HYPOTHESIS!!!\n",
						l_cp->th);
			}
			if (l_cp->th > l_cp->max_tiles) {
				l_cp->th= 1;
				opj_event_msg_v2(p_manager, EVT_WARNING, "- too large y, increase expectance of %d to continue\n",
					"- setting %d tiles in y => HYPOTHESIS!!!\n",
					l_cp->max_tiles, l_cp->th);
			}
		}
	}
#endif /* USE_JPWL */

	/* memory allocations */
	l_cp->tcps = (opj_tcp_v2_t*) opj_calloc(l_nb_tiles, sizeof(opj_tcp_v2_t));
	if (l_cp->tcps == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(l_cp->tcps,0,l_nb_tiles*sizeof(opj_tcp_t));

#ifdef USE_JPWL
	if (l_cp->correct) {
		if (!l_cp->tcps) {
			opj_event_msg_v2(p_manager, JPWL_ASSUME ? EVT_WARNING : EVT_ERROR,
				"JPWL: could not alloc tcps field of cp\n");
			if (!JPWL_ASSUME || JPWL_ASSUME) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "JPWL: giving up\n");
				return OPJ_FALSE;
			}
		}
	}
#endif /* USE_JPWL */

	p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps =
			(opj_tccp_t*) opj_calloc(l_image->numcomps, sizeof(opj_tccp_t));
	if(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps  == 00) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps ,0,l_image->numcomps*sizeof(opj_tccp_t));

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records =
			(opj_mct_data_t*)opj_malloc(J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mct_records,0,J2K_MCT_DEFAULT_NB_RECORDS * sizeof(opj_mct_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mct_records = J2K_MCT_DEFAULT_NB_RECORDS;

	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records =
			(opj_simple_mcc_decorrelation_data_t*)
			opj_malloc(J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));

	if (! p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
		return OPJ_FALSE;
	}
	memset(p_j2k->m_specific_param.m_decoder.m_default_tcp->m_mcc_records,0,J2K_MCC_DEFAULT_NB_RECORDS * sizeof(opj_simple_mcc_decorrelation_data_t));
	p_j2k->m_specific_param.m_decoder.m_default_tcp->m_nb_max_mcc_records = J2K_MCC_DEFAULT_NB_RECORDS;

	/* set up default dc level shift */
	for (i=0;i<l_image->numcomps;++i) {
		if (! l_image->comps[i].sgnd) {
			p_j2k->m_specific_param.m_decoder.m_default_tcp->tccps[i].m_dc_level_shift = 1 << (l_image->comps[i].prec - 1);
		}
	}

	l_current_tile_param = l_cp->tcps;
	for	(i = 0; i < l_nb_tiles; ++i) {
		l_current_tile_param->tccps = (opj_tccp_t*) opj_malloc(l_image->numcomps * sizeof(opj_tccp_t));
		if (l_current_tile_param->tccps == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory to take in charge SIZ marker\n");
			return OPJ_FALSE;
		}
		memset(l_current_tile_param->tccps,0,l_image->numcomps * sizeof(opj_tccp_t));

		++l_current_tile_param;
	}

	p_j2k->m_specific_param.m_decoder.m_state =  J2K_STATE_MH; /* FIXME J2K_DEC_STATE_MH; */
	opj_image_comp_header_update(l_image,l_cp);

	return OPJ_TRUE;
}